

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.h
# Opt level: O2

StringBuffer * __thiscall MeCab::anon_unknown_0::LatticeImpl::stream(LatticeImpl *this)

{
  StringBuffer *pSVar1;
  
  pSVar1 = (this->ostrs_).ptr_;
  if (pSVar1 != (StringBuffer *)0x0) {
    return pSVar1;
  }
  pSVar1 = (StringBuffer *)operator_new(0x28);
  pSVar1->_vptr_StringBuffer = (_func_int **)&PTR__StringBuffer_0019f328;
  pSVar1->ptr_ = (char *)0x0;
  pSVar1->size_ = 0;
  pSVar1->alloc_size_ = 0;
  pSVar1->is_delete_ = true;
  pSVar1->error_ = false;
  (this->ostrs_).ptr_ = pSVar1;
  return pSVar1;
}

Assistant:

T * get() const         { return ptr_;  }